

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.h
# Opt level: O2

HitList<DNA> * __thiscall
Search<DNA>::Query(HitList<DNA> *__return_storage_ptr__,Search<DNA> *this,Sequence<DNA> *query)

{
  Strand SVar1;
  Sequence<DNA> local_108;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  std::_Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::_Deque_base
            (&__return_storage_ptr__->super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>);
  SVar1 = this->mParams->strand;
  if ((SVar1 & ~Both) == Plus) {
    local_a8._8_8_ = 0;
    local_90 = std::
               _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:87:14)>
               ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:87:14)>
               ::_M_manager;
    local_a8._M_unused._M_object = __return_storage_ptr__;
    (**this->_vptr_Search)(this,query);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  }
  if (SVar1 - Minus < 2) {
    Sequence<DNA>::Reverse(&local_108,query);
    Sequence<DNA>::Complement((Sequence<DNA> *)&local_a8,&local_108);
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:95:7)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_Sequence<DNA>_&,_const_Cigar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Database/Search.h:95:7)>
               ::_M_manager;
    local_48._M_unused._M_object = __return_storage_ptr__;
    (**this->_vptr_Search)(this,&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    Sequence<DNA>::~Sequence((Sequence<DNA> *)&local_a8);
    Sequence<DNA>::~Sequence(&local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

inline HitList< DNA > Search< DNA >::Query( const Sequence< DNA >& query ) {
  HitList< DNA > hits;

  auto strand = mParams.strand;

  if( strand == DNA::Strand::Plus || strand == DNA::Strand::Both ) {
    SearchForHits(
      query, [&]( const Sequence< DNA >& target, const Cigar& alignment ) {
        hits.push_back( { target, alignment, DNA::Strand::Plus } );
      } );
  }

  if( strand == DNA::Strand::Minus || strand == DNA::Strand::Both ) {
    SearchForHits(
      query.Reverse().Complement(),
      [&]( const Sequence< DNA >& target, const Cigar& alignment ) {
        hits.push_back( { target, alignment, DNA::Strand::Minus } );
      } );
  }

  return hits;
}